

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O3

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::
boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  type_info *ptVar4;
  type_info *ptVar5;
  bool bVar6;
  undefined8 *puVar7;
  Type_Conversions_State *extraout_RDX;
  Type_Conversions_State *extraout_RDX_00;
  Boxed_Value BVar8;
  undefined1 local_78 [16];
  uint local_68;
  undefined4 uStack_64;
  pointer_____offset_0x10___ *local_58;
  pointer_____offset_0x10___ *local_50;
  undefined4 local_48;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78._0_8_ =
         &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>_const*::
          typeinfo;
    local_78._8_8_ =
         &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo;
    local_68 = 5;
    bVar6 = Type_Info::bare_equal(*(Type_Info **)this,(Type_Info *)local_78);
    t_conversions = extraout_RDX;
    if ((!bVar6) &&
       (bVar6 = Type_Conversions::
                convertable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), t_conversions = extraout_RDX_00, bVar6)) {
      bVar6 = Type_Conversions::
              convertable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
                        ((Type_Conversions *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (!bVar6) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x38);
        puVar3 = *(undefined8 **)this;
        _local_68 = puVar3[2];
        ptVar4 = (type_info *)*puVar3;
        ptVar5 = (type_info *)puVar3[1];
        *puVar7 = &PTR__bad_cast_003205b8;
        local_78._0_4_ = SUB84(ptVar4,0);
        local_78._4_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
        local_78._8_4_ = SUB84(ptVar5,0);
        local_78._12_4_ = (undefined4)((ulong)ptVar5 >> 0x20);
        *(undefined4 *)(puVar7 + 1) = local_78._0_4_;
        *(undefined4 *)((long)puVar7 + 0xc) = local_78._4_4_;
        *(undefined4 *)(puVar7 + 2) = local_78._8_4_;
        *(undefined4 *)((long)puVar7 + 0x14) = local_78._12_4_;
        puVar7[3] = _local_68;
        puVar7[4] = &std::
                     vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>_const*
                     ::typeinfo;
        puVar7[5] = 0x19;
        puVar7[6] = "Cannot perform boxed_cast";
        local_78._0_8_ = ptVar4;
        local_78._8_8_ = ptVar5;
        __cxa_throw(puVar7,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_58 = &std::
                  vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>_const*::
                  typeinfo;
      local_50 = &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                  typeinfo;
      local_48 = 5;
      BVar8 = Type_Conversions::boxed_type_conversion
                        ((Type_Conversions *)local_78,
                         &((bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_type_info,(Conversion_Saves *)&local_58,
                         (Boxed_Value *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      _Var1._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78._0_8_ + 0x28);
      detail::verify_type_no_throw<void>
                ((Boxed_Value *)local_78._0_8_,
                 (type_info *)
                 &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                  typeinfo,
                 BVar8.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               _Var1._M_pi;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      return (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             _Var1._M_pi;
    }
  }
  p_Var2 = (*(Boxed_Value **)this)[2].m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  detail::verify_type_no_throw<void>
            (*(Boxed_Value **)this,
             (type_info *)
             &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo
             ,t_conversions);
  return (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)p_Var2;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }